

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_info.c
# Opt level: O3

void do_weather(CHAR_DATA *ch,char *argument)

{
  short sVar1;
  AREA_DATA_conflict *pAVar2;
  bool bVar3;
  char *__s;
  char buf [4608];
  char buf2 [4608];
  char acStack_2418 [4608];
  char local_1218 [4616];
  
  __s = acStack_2418;
  bVar3 = is_outside(ch);
  pAVar2 = ch->in_room->area;
  if (bVar3) {
    sprintf(acStack_2418,"%s and the %s air %s\n\r",
            _ZL8sky_look_rel + *(int *)(_ZL8sky_look_rel + (long)pAVar2->sky * 4),
            temp_look[pAVar2->temp],
            _ZL9wind_look_rel + *(int *)(_ZL9wind_look_rel + (long)pAVar2->wind * 4));
    send_to_char(acStack_2418,ch);
    if (sun == 2) {
      return;
    }
    sVar1 = ch->in_room->area->sky;
    if (sVar1 == 2 || 3 < sVar1) {
      __s = "You cannot make out the twin moons through the thick cloud cover.\n\r";
    }
    else {
      __s = local_1218;
      sprintf(__s,"Berus is %s and Calabren is %s.\n\r",moon_look[moon_berus],
              moon_look[moon_calabren]);
    }
  }
  else {
    sprintf(acStack_2418,"You can\'t see the sky from here, but the air around you is %s.\n\r",
            temp_look[pAVar2->temp]);
  }
  send_to_char(__s,ch);
  return;
}

Assistant:

void do_weather(CHAR_DATA *ch, char *argument)
{
	char buf[MAX_STRING_LENGTH], buf2[MAX_STRING_LENGTH];

	if (!is_outside(ch))
	{
		sprintf(buf, "You can't see the sky from here, but the air around you is %s.\n\r", temp_look[ch->in_room->area->temp]);
		send_to_char(buf, ch);
		return;
	}

	sprintf(buf, "%s and the %s air %s\n\r",
		sky_look[ch->in_room->area->sky],
		temp_look[ch->in_room->area->temp],
		wind_look[ch->in_room->area->wind]);
	send_to_char(buf, ch);

	if (sun != SolarPosition::Daylight)
	{
		if (ch->in_room->area->sky == WeatherCondition::Overcast || ch->in_room->area->sky >= WeatherCondition::Downpour)
		{
			send_to_char("You cannot make out the twin moons through the thick cloud cover.\n\r", ch);
			return;
		}

		sprintf(buf2, "Berus is %s and Calabren is %s.\n\r", moon_look[moon_berus], moon_look[moon_calabren]);
		send_to_char(buf2, ch);
	}
}